

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O1

void __thiscall
fasttext::Loss::predict(Loss *this,int32_t k,real threshold,Predictions *heap,State *state)

{
  _Iter_comp_iter<bool_(*)(const_std::pair<float,_int>_&,_const_std::pair<float,_int>_&)> __cmp;
  _Iter_comp_iter<bool_(*)(const_std::pair<float,_int>_&,_const_std::pair<float,_int>_&)> local_20;
  
  (*this->_vptr_Loss[3])(this,state);
  findKBest(this,k,threshold,heap,&state->output);
  local_20._M_comp = comparePairs;
  std::
  __sort_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>>
            ((heap->
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
             _M_impl.super__Vector_impl_data._M_start,
             (heap->
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
             _M_impl.super__Vector_impl_data._M_finish,&local_20);
  return;
}

Assistant:

void Loss::predict(
    int32_t k,
    real threshold,
    Predictions& heap,
    Model::State& state) const {
  computeOutput(state);
  findKBest(k, threshold, heap, state.output);
  std::sort_heap(heap.begin(), heap.end(), comparePairs);
}